

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

void __thiscall QNetworkRequest::setAttribute(QNetworkRequest *this,Attribute code,QVariant *value)

{
  __atomic_base<int> _Var1;
  QNetworkRequestPrivate *pQVar2;
  long in_FS_OFFSET;
  Attribute copy;
  Attribute local_28;
  Attribute local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  _Var1._M_i = *(__int_type *)
                &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value;
  local_28 = code;
  if (*(ulong *)&(value->d).field_0x18 < 4) {
    if (_Var1._M_i != 1) {
      QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
      pQVar2 = (this->d).d.ptr;
    }
    QHash<QNetworkRequest::Attribute,_QVariant>::removeImpl<QNetworkRequest::Attribute>
              (&(pQVar2->super_QNetworkHeadersPrivate).attributes,&local_28);
  }
  else {
    if ((__atomic_base<int>)_Var1._M_i != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
      pQVar2 = (this->d).d.ptr;
    }
    local_24 = code;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)
               &(pQVar2->super_QNetworkHeadersPrivate).attributes,&local_24,value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequest::setAttribute(Attribute code, const QVariant &value)
{
    if (value.isValid())
        d->attributes.insert(code, value);
    else
        d->attributes.remove(code);
}